

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O0

int Shr_ManDivPushOrderByLevel(Shr_Man_t *p,int iDiv)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  Gia_Obj_t *pGVar6;
  int t;
  int *pArray;
  int iPlace;
  int iDiv_local;
  Shr_Man_t *p_local;
  
  Vec_IntPush(p->vPrio,iDiv);
  iVar2 = Vec_IntSize(p->vPrio);
  if (iVar2 == 1) {
    p_local._4_4_ = 0;
  }
  else {
    piVar5 = Vec_IntArray(p->vPrio);
    iVar2 = Vec_IntSize(p->vPrio);
    while (pArray._0_4_ = iVar2 + -1, 0 < (int)pArray) {
      pGVar1 = p->pNew;
      pGVar6 = Gia_ManObj(p->pNew,piVar5[iVar2 + -2]);
      iVar3 = Gia_ObjLevel(pGVar1,pGVar6);
      pGVar1 = p->pNew;
      pGVar6 = Gia_ManObj(p->pNew,piVar5[(int)pArray]);
      iVar4 = Gia_ObjLevel(pGVar1,pGVar6);
      if (iVar3 <= iVar4) break;
      iVar3 = piVar5[iVar2 + -2];
      piVar5[iVar2 + -2] = piVar5[(int)pArray];
      piVar5[(int)pArray] = iVar3;
      iVar2 = (int)pArray;
    }
    p_local._4_4_ = (int)pArray;
  }
  return p_local._4_4_;
}

Assistant:

static inline int Shr_ManDivPushOrderByLevel( Shr_Man_t * p, int iDiv )
{
    int iPlace, * pArray;
    Vec_IntPush( p->vPrio, iDiv );
    if ( Vec_IntSize(p->vPrio) == 1 )
        return 0; 
    pArray = Vec_IntArray(p->vPrio);
    for ( iPlace = Vec_IntSize(p->vPrio) - 1; iPlace > 0; iPlace-- )
        if ( Gia_ObjLevel(p->pNew, Gia_ManObj(p->pNew, pArray[iPlace-1])) > 
             Gia_ObjLevel(p->pNew, Gia_ManObj(p->pNew, pArray[iPlace])) )
             ABC_SWAP( int, pArray[iPlace-1], pArray[iPlace] )
        else
            break;
    return iPlace; // the place of the new divisor
}